

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O3

color_theme * color_theme_create(void)

{
  color_theme *pcVar1;
  
  pcVar1 = (color_theme *)calloc(1,0x20);
  return pcVar1;
}

Assistant:

struct color_theme *color_theme_create(void)
{
        struct color_theme *theme = malloc(sizeof(struct color_theme));

        if (theme == NULL) {
                return NULL;
        }

        theme->unfocused = NULL;
        theme->focused = NULL;
        theme->urgent = NULL;
        theme->sticky = NULL;

        return theme;
}